

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
update(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
       *this,char_range key)

{
  uint32_t uVar1;
  uint32_t uVar2;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar3;
  bool bVar4;
  byte bVar5;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> _Var6;
  undefined8 *puVar7;
  char *pcVar8;
  ulong uVar9;
  uint64_t pos;
  ulong uVar10;
  uint64_t node_id;
  char_range local_1e0;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  local_1d0;
  
  local_1e0.end = key.end;
  local_1e0.begin = key.begin;
  if (local_1e0.begin == local_1e0.end) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar7 = &PTR__exception_00108d90;
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (local_1e0.end[-1] == 0) {
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map(&local_1d0,0,0x20);
          operator=(this,&local_1d0);
          ~map(&local_1d0);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
        pos = 1;
LAB_00103e89:
        _Var6._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
             plain_bonsai_nlm<int>::insert(&this->label_store_,pos,&local_1e0);
      }
      else {
        local_1d0._0_8_ = 1;
        do {
          uVar9 = (long)local_1e0.end - (long)local_1e0.begin;
          tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
                &(this->label_store_).ptrs_.
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_1d0._0_8_]._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
          if (uVar9 == 0) {
            if (tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
                (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
LAB_00103e38:
              return (value_type *)
                     ((long)tVar3.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar9);
            }
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            while (local_1e0.begin[uVar10] ==
                   *(byte *)((long)tVar3.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            uVar10)) {
              uVar10 = uVar10 + 1;
              if (uVar9 == uVar10) goto LAB_00103e38;
            }
          }
          local_1e0.begin = local_1e0.begin + uVar10;
          if (this->lambda_ <= uVar10) {
            do {
              bVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                                (&this->hash_trie_,(uint64_t *)&local_1d0,0xff);
              if (bVar4) {
                expand_if_needed_(this,(uint64_t *)&local_1d0);
              }
              uVar10 = uVar10 - this->lambda_;
            } while (this->lambda_ <= uVar10);
          }
          bVar5 = (this->codes_)._M_elems[*local_1e0.begin];
          if (bVar5 == 0xff) {
            uVar2 = this->num_codes_;
            uVar1 = uVar2 + 1;
            this->num_codes_ = uVar1;
            (this->codes_)._M_elems[*local_1e0.begin] = (uchar)uVar2;
            if (uVar1 == 0xff) {
              puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar7 = &PTR__exception_00108d90;
              pcVar8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
              ;
              goto LAB_00103f1b;
            }
            bVar5 = (this->codes_)._M_elems[*local_1e0.begin];
          }
          bVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                            (&this->hash_trie_,(uint64_t *)&local_1d0,uVar10 << 8 | (ulong)bVar5);
          if (bVar4) {
            expand_if_needed_(this,(uint64_t *)&local_1d0);
            local_1e0.begin = local_1e0.begin + 1;
            this->size_ = this->size_ + 1;
            pos = local_1d0._0_8_;
            goto LAB_00103e89;
          }
          local_1e0.begin = local_1e0.begin + 1;
        } while (local_1e0.begin != local_1e0.end);
        _Var6._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (this->label_store_).ptrs_.
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_1d0._0_8_]._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t;
      }
      return (value_type *)
             _Var6._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar7 = &PTR__exception_00108d90;
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_00103f1b:
  puVar7[1] = pcVar8;
  __cxa_throw(puVar7,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }